

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_dio.cc
# Opt level: O0

bool __thiscall
sptk::PitchExtractionByDio::Get
          (PitchExtractionByDio *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  undefined4 uVar5;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  int target_length;
  vector<double,_std::allocator<double>_> tmp_f0;
  vector<double,_std::allocator<double>_> time_axis;
  int tmp_length;
  double frame_period;
  DioOption option;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *this_00;
  DioOption *in_stack_fffffffffffffeb0;
  vector<double,_std::allocator<double>_> *this_01;
  undefined8 in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> local_b8 [3];
  int local_6c;
  double local_68;
  DioOption local_60;
  long local_20;
  vector<double,_std::allocator<double>_> *local_18;
  bool local_1;
  
  if (((*(byte *)(in_RDI + 0x30) & 1) == 0) ||
     (local_20 = in_RDX, local_18 = in_RSI,
     bVar1 = std::vector<double,_std::allocator<double>_>::empty
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0), bVar1
     )) {
    local_1 = false;
  }
  else {
    if (local_20 != 0) {
      world::InitializeDioOption(&local_60);
      local_68 = ((double)*(int *)(in_RDI + 8) * 1000.0) / *(double *)(in_RDI + 0x10);
      local_60.f0_floor = *(double *)(in_RDI + 0x18);
      local_60.f0_ceil = *(double *)(in_RDI + 0x20);
      local_60.allowed_range = *(double *)(in_RDI + 0x28);
      dVar6 = *(double *)(in_RDI + 0x10);
      local_60.frame_period = local_68;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      local_6c = world::GetSamplesForDIO((int)dVar6,(int)sVar3,local_68);
      std::allocator<double>::allocator((allocator<double> *)0x10a753);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      std::allocator<double>::~allocator((allocator<double> *)0x10a779);
      _Var4._M_current = (double *)(long)local_6c;
      std::allocator<double>::allocator((allocator<double> *)0x10a798);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      std::allocator<double>::~allocator((allocator<double> *)0x10a7be);
      __first._M_current =
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10a7cb);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      uVar5 = (undefined4)sVar3;
      iVar2 = (int)*(double *)(in_RDI + 0x10);
      __last._M_current =
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10a7ff);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x10a811);
      world::Dio(__first._M_current,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (int)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (double *)in_stack_fffffffffffffea8,(double *)0x10a833);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      auVar7._8_4_ = (int)(sVar3 >> 0x20);
      auVar7._0_8_ = sVar3;
      auVar7._12_4_ = 0x45300000;
      dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
                   (double)*(int *)(in_RDI + 8));
      if ((int)dVar6 < local_6c) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   CONCAT44(iVar2,uVar5));
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)__last._M_current,CONCAT44(iVar2,uVar5))
      ;
      this_01 = local_b8;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffea8);
      __result._M_current._4_4_ = iVar2;
      __result._M_current._0_4_ = uVar5;
      _Var4 = std::
              copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var4,__last,__result);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffea8);
      this_00 = local_b8;
      std::vector<double,_std::allocator<double>_>::size(this_00);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                _Var4._M_current,(difference_type)this_01);
      std::vector<double,_std::allocator<double>_>::end(this_00);
      std::vector<double,_std::allocator<double>_>::back(this_01);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,_Var4,(double *)this_01);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__first._M_current);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__first._M_current);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PitchExtractionByDio::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    world::DioOption option;
    world::InitializeDioOption(&option);

    const double frame_period((1000.0 * frame_shift_) / sampling_rate_);
    option.frame_period = frame_period;
    option.f0_floor = lower_f0_;
    option.f0_ceil = upper_f0_;
    option.allowed_range = voicing_threshold_;

    const int tmp_length(world::GetSamplesForDIO(
        static_cast<int>(sampling_rate_), static_cast<int>(waveform.size()),
        frame_period));
    std::vector<double> time_axis(tmp_length);
    std::vector<double> tmp_f0(tmp_length);
    world::Dio(waveform.data(), static_cast<int>(waveform.size()),
               static_cast<int>(sampling_rate_), &option, time_axis.data(),
               tmp_f0.data());

    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}